

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotPieChart<unsigned_int>
               (char **label_ids,uint *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ImU32 col_00;
  ImDrawList *this;
  ImPlotItem *pIVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ImVec2 local_120;
  double local_118;
  ImVec2 local_10c;
  ImVec2 local_104;
  ImU32 local_fc;
  ImVec2 IStack_f8;
  ImU32 col_1;
  ImVec2 pos;
  double angle;
  ImVec2 size;
  double percent_1;
  ImPlotItem *item;
  char local_c8 [4];
  int i_2;
  char buffer [32];
  ImU32 col;
  double percent;
  int i_1;
  double a1;
  double a0;
  ImPlotPoint center;
  double dStack_60;
  int i;
  double sum;
  ImDrawList *DrawList;
  double angle0_local;
  char *fmt_local;
  bool normalize_local;
  double radius_local;
  double y_local;
  double x_local;
  int count_local;
  uint *values_local;
  char **label_ids_local;
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/implot/implot_items.cpp"
                  ,0x63c,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = unsigned int]"
                 );
  }
  this = GetPlotDrawList();
  dStack_60 = 0.0;
  for (center.y._4_4_ = 0; center.y._4_4_ < count; center.y._4_4_ = center.y._4_4_ + 1) {
    dStack_60 = (double)values[center.y._4_4_] + dStack_60;
  }
  ImPlotPoint::ImPlotPoint((ImPlotPoint *)&a0,x,y);
  PushPlotClipRect();
  a1 = (angle0 * 2.0 * 3.1415927410125732) / 360.0;
  for (percent._4_4_ = 0; percent._4_4_ < count; percent._4_4_ = percent._4_4_ + 1) {
    if (!normalize && dStack_60 <= 1.0) {
      local_118 = (double)values[percent._4_4_];
    }
    else {
      local_118 = (double)values[percent._4_4_] / dStack_60;
    }
    dVar5 = local_118 * 6.2831854820251465 + a1;
    bVar3 = BeginItem(label_ids[percent._4_4_],-1);
    if (bVar3) {
      pIVar4 = GetCurrentItem();
      col_00 = ImGui::GetColorU32(&pIVar4->Color);
      if (0.5 <= local_118) {
        RenderPieSlice(this,(ImPlotPoint *)&a0,radius,a1,(dVar5 - a1) * 0.5 + a1,col_00);
        RenderPieSlice(this,(ImPlotPoint *)&a0,radius,(dVar5 - a1) * 0.5 + a1,dVar5,col_00);
      }
      else {
        RenderPieSlice(this,(ImPlotPoint *)&a0,radius,a1,dVar5,col_00);
      }
      EndItem();
    }
    a1 = dVar5;
  }
  if (fmt != (char *)0x0) {
    a1 = (angle0 * 2.0 * 3.1415927410125732) / 360.0;
    for (item._4_4_ = 0; item._4_4_ < count; item._4_4_ = item._4_4_ + 1) {
      pIVar4 = GetItem(label_ids[item._4_4_]);
      if (!normalize && dStack_60 <= 1.0) {
        local_120 = (ImVec2)(double)values[item._4_4_];
      }
      else {
        local_120 = (ImVec2)((double)values[item._4_4_] / dStack_60);
      }
      size = local_120;
      dVar5 = (double)local_120 * 6.2831854820251465 + a1;
      if ((pIVar4->Show & 1U) != 0) {
        sprintf(local_c8,fmt,(double)values[item._4_4_]);
        angle = (double)ImGui::CalcTextSize(local_c8,(char *)0x0,false,-1.0);
        dVar1 = a0;
        pos = (ImVec2)((dVar5 - a1) * 0.5 + a1);
        dVar6 = cos((double)pos);
        dVar2 = center.x;
        dVar7 = sin((double)pos);
        IStack_f8 = PlotToPixels(radius * 0.5 * dVar6 + dVar1,radius * 0.5 * dVar7 + dVar2,-1);
        local_fc = CalcTextColor(&pIVar4->Color);
        local_10c = ::operator*((ImVec2 *)&angle,0.5);
        local_104 = ::operator-(&stack0xffffffffffffff08,&local_10c);
        ImDrawList::AddText(this,&local_104,local_fc,local_c8,(char *)0x0);
      }
      a1 = dVar5;
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = ImGui::GetColorU32(GetCurrentItem()->Color);
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col = CalcTextColor(item->Color);
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}